

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

int commit_stack(Parser *p,SNode *sn)

{
  PNode *pPVar1;
  uint32 uVar2;
  PNode *pPVar3;
  PNode *tpn;
  int res;
  SNode *sn_local;
  Parser *p_local;
  
  tpn._4_4_ = 0;
  if ((sn->zns).n == 1) {
    if (((*(sn->zns).v)->sns).n < 2) {
      if (((((*(sn->zns).v)->pn->parse_node).start_loc.s == ((*(sn->zns).v)->pn->parse_node).end) &&
          ((*(sn->zns).v)->pn->reduction != (D_Reduction *)0x0)) &&
         ((*(sn->zns).v)->pn->reduction->final_code != (D_ReductionCode)0x0)) {
        p_local._4_4_ = -3;
      }
      else if ((((*(sn->zns).v)->sns).n == 0) ||
              (tpn._4_4_ = commit_stack(p,*((*(sn->zns).v)->sns).v), p_local._4_4_ = tpn._4_4_,
              -1 < tpn._4_4_)) {
        pPVar3 = commit_tree(p,(*(sn->zns).v)->pn);
        if (pPVar3 == (PNode *)0x0) {
          p_local._4_4_ = -4;
        }
        else {
          if (pPVar3 != (*(sn->zns).v)->pn) {
            pPVar3->refcount = pPVar3->refcount + 1;
            pPVar1 = (*(sn->zns).v)->pn;
            uVar2 = pPVar1->refcount - 1;
            pPVar1->refcount = uVar2;
            if (uVar2 == 0) {
              free_PNode(p,(*(sn->zns).v)->pn);
            }
            (*(sn->zns).v)->pn = pPVar3;
          }
          p_local._4_4_ = tpn._4_4_;
        }
      }
    }
    else {
      p_local._4_4_ = -2;
    }
  }
  else {
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

static int commit_stack(Parser *p, SNode *sn) {
  int res = 0;
  PNode *tpn;

  if (sn->zns.n != 1) return -1;
  if (sn->zns.v[0]->sns.n > 1) return -2;
  if (is_unreduced_epsilon_PNode(sn->zns.v[0]->pn)) /* wait till reduced */
    return -3;
  if (sn->zns.v[0]->sns.n)
    if ((res = commit_stack(p, sn->zns.v[0]->sns.v[0])) < 0) return res;
  tpn = commit_tree(p, sn->zns.v[0]->pn);
  if (!tpn) return -4;
  if (tpn != sn->zns.v[0]->pn) {
    ref_pn(tpn);
    unref_pn(p, sn->zns.v[0]->pn);
    sn->zns.v[0]->pn = tpn;
  }
  return res;
}